

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NavierStokesBase.cpp
# Opt level: O0

void __thiscall
NavierStokesBase::SyncProjInterp
          (NavierStokesBase *this,MultiFab *phi,int c_lev,MultiFab *P_new,MultiFab *P_old,int f_lev,
          IntVect *ratio)

{
  initializer_list<int> iVar1;
  bool bVar2;
  Long LVar3;
  type val;
  anon_class_192_3_ddcb78cd *f;
  MFIter *mfi_00;
  FabArrayBase *in_RCX;
  FabArray<amrex::FArrayBox> *in_stack_00000008;
  Array4<double> *p_old;
  Array4<double> *p_new;
  Array4<double> *f_phi;
  Elixir fine_phi_i;
  FArrayBox fine_phi;
  Box *bx;
  MFIter mfi;
  MultiFab crse_phi;
  unique_ptr<amrex::EBFArrayBoxFactory,_std::default_delete<amrex::EBFArrayBoxFactory>_> factory;
  Geometry *cgeom;
  Geometry *fgeom;
  Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> bc;
  int i;
  BoxArray crse_ba;
  int N;
  BoxArray *P_grids;
  allocator_type *in_stack_fffffffffffff8b8;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffff8c0;
  undefined4 in_stack_fffffffffffff8c8;
  int in_stack_fffffffffffff8cc;
  Geometry *in_stack_fffffffffffff8d0;
  undefined8 in_stack_fffffffffffff8d8;
  EBSupport a_support;
  int in_stack_fffffffffffff8e0;
  int in_stack_fffffffffffff8e4;
  undefined1 do_tiling_;
  int in_stack_fffffffffffff8e8;
  int in_stack_fffffffffffff8ec;
  undefined4 in_stack_fffffffffffff8f0;
  int in_stack_fffffffffffff8f4;
  Geometry *in_stack_fffffffffffff8f8;
  CpOp op;
  MultiFab *in_stack_fffffffffffff900;
  BaseFab<double> *this_00;
  FabFactory<amrex::FArrayBox> *in_stack_fffffffffffff910;
  FabArrayBase *this_01;
  undefined1 local_688 [16];
  IntVect *in_stack_fffffffffffff988;
  Box *in_stack_fffffffffffff990;
  NodeBilinear *in_stack_fffffffffffff998;
  undefined1 auStack_648 [64];
  int in_stack_fffffffffffff9f8;
  int in_stack_fffffffffffff9fc;
  FArrayBox *in_stack_fffffffffffffa00;
  int in_stack_fffffffffffffa0c;
  FArrayBox *in_stack_fffffffffffffa10;
  NodeBilinear *in_stack_fffffffffffffa18;
  undefined1 local_5c8 [64];
  undefined1 *local_588;
  undefined1 local_580 [64];
  undefined1 *local_540;
  Array4<double> local_538;
  Array4<double> *local_4f8;
  BaseFab<double> local_4d8;
  undefined1 local_48c [28];
  undefined1 *local_470;
  MFIter local_468;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined8 local_3e8;
  Box *in_stack_fffffffffffffc20;
  IntVect *in_stack_fffffffffffffc28;
  Geometry *in_stack_fffffffffffffc30;
  Geometry *in_stack_fffffffffffffc38;
  Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *in_stack_fffffffffffffc40;
  int in_stack_fffffffffffffc48;
  int in_stack_fffffffffffffc50;
  RunOn in_stack_fffffffffffffc58;
  undefined4 local_25c;
  undefined4 local_258;
  undefined4 local_254;
  undefined4 *local_250;
  undefined8 local_248;
  Geometry *local_220;
  Geometry *local_218;
  int local_1a4;
  int local_134;
  BoxArray *local_130;
  FabArrayBase *local_118;
  BaseFab<double> *local_f8;
  Dim3 local_f0;
  Dim3 local_dc [2];
  Dim3 local_c0;
  Box *local_b0;
  Box *local_90;
  undefined4 local_7c;
  Box *local_78;
  undefined4 local_6c;
  Box *local_68;
  undefined4 local_5c;
  Box *local_58;
  Dim3 local_50;
  Box *local_40;
  int local_38;
  int iStack_34;
  int local_30;
  undefined4 local_2c;
  IntVect *local_28;
  undefined4 local_1c;
  IntVect *local_18;
  undefined4 local_c;
  IntVect *local_8;
  
  local_118 = in_RCX;
  local_130 = amrex::FabArrayBase::boxArray(in_RCX);
  LVar3 = amrex::BoxArray::size((BoxArray *)0x7c0630);
  local_134 = (int)LVar3;
  amrex::BoxArray::BoxArray((BoxArray *)in_stack_fffffffffffff8c0,(size_t)in_stack_fffffffffffff8b8)
  ;
  for (local_1a4 = 0; a_support = (EBSupport)((ulong)in_stack_fffffffffffff8d8 >> 0x20),
      local_1a4 < local_134; local_1a4 = local_1a4 + 1) {
    amrex::BoxArray::operator[]((BoxArray *)in_stack_fffffffffffff8d0,in_stack_fffffffffffff8cc);
    amrex::NodeBilinear::CoarseBox
              (in_stack_fffffffffffff998,in_stack_fffffffffffff990,in_stack_fffffffffffff988);
    amrex::BoxArray::set
              ((BoxArray *)in_stack_fffffffffffff8f8,in_stack_fffffffffffff8f4,
               (Box *)CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8));
  }
  std::allocator<amrex::BCRec>::allocator((allocator<amrex::BCRec> *)0x7c0720);
  amrex::Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::vector
            ((Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)in_stack_fffffffffffff8c0,
             (size_type)in_stack_fffffffffffff8b8,(allocator_type *)0x7c073a);
  std::allocator<amrex::BCRec>::~allocator((allocator<amrex::BCRec> *)0x7c0749);
  local_218 = amrex::AmrMesh::Geom
                        ((AmrMesh *)in_stack_fffffffffffff8c0,
                         (int)((ulong)in_stack_fffffffffffff8b8 >> 0x20));
  local_220 = amrex::AmrMesh::Geom
                        ((AmrMesh *)in_stack_fffffffffffff8c0,
                         (int)((ulong)in_stack_fffffffffffff8b8 >> 0x20));
  amrex::FabArrayBase::DistributionMap(local_118);
  local_25c = 1;
  local_258 = 1;
  local_254 = 1;
  local_250 = &local_25c;
  local_248 = 3;
  std::allocator<int>::allocator((allocator<int> *)0x7c0809);
  iVar1._M_array._4_4_ = in_stack_fffffffffffff8cc;
  iVar1._M_array._0_4_ = in_stack_fffffffffffff8c8;
  iVar1._M_len = (size_type)in_stack_fffffffffffff8d0;
  amrex::Vector<int,_std::allocator<int>_>::vector
            ((Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff8c0,iVar1,
             in_stack_fffffffffffff8b8);
  amrex::makeEBFabFactory
            (in_stack_fffffffffffff8f8,
             (BoxArray *)CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0),
             (DistributionMapping *)CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8),
             (Vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0),a_support);
  amrex::Vector<int,_std::allocator<int>_>::~Vector((Vector<int,_std::allocator<int>_> *)0x7c0872);
  std::allocator<int>::~allocator((allocator<int> *)0x7c087f);
  amrex::FabArrayBase::DistributionMap(local_118);
  local_3f8 = 0;
  uStack_3f0 = 0;
  local_408 = 0;
  uStack_400 = 0;
  local_3e8 = 0;
  amrex::MFInfo::MFInfo((MFInfo *)0x7c08bd);
  val = std::unique_ptr<amrex::EBFArrayBoxFactory,_std::default_delete<amrex::EBFArrayBoxFactory>_>
        ::operator*((unique_ptr<amrex::EBFArrayBoxFactory,_std::default_delete<amrex::EBFArrayBoxFactory>_>
                     *)in_stack_fffffffffffff8c0);
  amrex::MultiFab::MultiFab
            (in_stack_fffffffffffff900,(BoxArray *)in_stack_fffffffffffff8f8,
             (DistributionMapping *)CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0),
             in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8,
             (MFInfo *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0),
             in_stack_fffffffffffff910);
  op = (CpOp)in_stack_fffffffffffff900;
  amrex::MFInfo::~MFInfo((MFInfo *)0x7c091b);
  amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
            (in_stack_fffffffffffff8c0,(value_type)val);
  amrex::Periodicity::NonPeriodic();
  mfi_00 = (MFIter *)((ulong)val & 0xffffffff00000000);
  amrex::FabArray<amrex::FArrayBox>::ParallelCopy
            ((FabArray<amrex::FArrayBox> *)
             CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0),
             (FabArray<amrex::FArrayBox> *)
             CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8),in_stack_fffffffffffff8e4
             ,in_stack_fffffffffffff8e0,a_support,(Periodicity *)in_stack_fffffffffffff8d0,op);
  do_tiling_ = (undefined1)((uint)in_stack_fffffffffffff8e4 >> 0x18);
  amrex::EB_set_covered((MultiFab *)in_stack_fffffffffffff8c0,(Real)mfi_00);
  amrex::TilingIfNotGPU();
  amrex::MFIter::MFIter
            ((MFIter *)CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0),
             (FabArrayBase *)CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8),
             (bool)do_tiling_);
  this_01 = local_118;
  while( true ) {
    bVar2 = amrex::MFIter::isValid(&local_468);
    if (!bVar2) break;
    amrex::MFIter::tilebox((MFIter *)this_01);
    local_470 = local_48c;
    amrex::FArrayBox::FArrayBox
              ((FArrayBox *)in_stack_fffffffffffff8d0,
               (Box *)CONCAT44(in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8),
               (int)((ulong)in_stack_fffffffffffff8c0 >> 0x20),
               SUB81((ulong)in_stack_fffffffffffff8c0 >> 0x18,0),
               SUB81((ulong)in_stack_fffffffffffff8c0 >> 0x10,0),(Arena *)mfi_00);
    this_00 = &local_4d8;
    amrex::BaseFab<double>::elixir<double,_0>
              ((BaseFab<double> *)CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8));
    f = (anon_class_192_3_ddcb78cd *)
        amrex::FabArray<amrex::FArrayBox>::operator[](in_stack_fffffffffffff8c0,mfi_00);
    mfi_00 = (MFIter *)amrex::BaseFab<double>::box(this_00);
    in_stack_fffffffffffff8c8 = SUB84(local_220,0);
    in_stack_fffffffffffff8cc = (int)((ulong)local_220 >> 0x20);
    in_stack_fffffffffffff8e8 = 1;
    in_stack_fffffffffffff8c0 = in_stack_00000008;
    in_stack_fffffffffffff8d0 = local_218;
    amrex::NodeBilinear::interp
              (in_stack_fffffffffffffa18,in_stack_fffffffffffffa10,in_stack_fffffffffffffa0c,
               in_stack_fffffffffffffa00,in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8,
               in_stack_fffffffffffffc20,in_stack_fffffffffffffc28,in_stack_fffffffffffffc30,
               in_stack_fffffffffffffc38,in_stack_fffffffffffffc40,in_stack_fffffffffffffc48,
               in_stack_fffffffffffffc50,in_stack_fffffffffffffc58);
    local_f8 = &local_4d8;
    local_b0 = &local_4d8.domain;
    local_5c = 0;
    local_6c = 1;
    local_7c = 2;
    local_8 = &local_4d8.domain.bigend;
    local_c = 0;
    local_38 = local_4d8.domain.bigend.vect[0] + 1;
    local_18 = &local_4d8.domain.bigend;
    local_1c = 1;
    iStack_34 = local_4d8.domain.bigend.vect[1] + 1;
    local_28 = &local_4d8.domain.bigend;
    local_2c = 2;
    local_f0.z = local_4d8.domain.bigend.vect[2] + 1;
    local_f0.y = iStack_34;
    local_f0.x = local_38;
    local_dc[0]._0_8_ = local_f0._0_8_;
    local_dc[0].z = local_f0.z;
    local_90 = local_b0;
    local_78 = local_b0;
    local_68 = local_b0;
    local_58 = local_b0;
    local_50._0_8_ = local_f0._0_8_;
    local_50.z = local_f0.z;
    local_40 = local_b0;
    local_30 = local_f0.z;
    amrex::Array4<double>::Array4(&local_538,local_4d8.dptr,&local_c0,local_dc,local_4d8.nvar);
    local_4f8 = &local_538;
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              ((FabArray<amrex::FArrayBox> *)
               CONCAT44(in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8),
               (MFIter *)in_stack_fffffffffffff8c0);
    local_540 = local_580;
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              ((FabArray<amrex::FArrayBox> *)
               CONCAT44(in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8),
               (MFIter *)in_stack_fffffffffffff8c0);
    local_588 = local_5c8;
    memcpy(local_688,local_4f8,0x3c);
    memcpy(auStack_648,local_588,0x3c);
    memcpy(&stack0xfffffffffffff9f8,local_540,0x3c);
    amrex::
    ParallelFor<NavierStokesBase::SyncProjInterp(amrex::MultiFab&,int,amrex::MultiFab&,amrex::MultiFab&,int,amrex::IntVect&)::__0>
              ((Box *)this_00,f);
    amrex::Gpu::Elixir::~Elixir((Elixir *)in_stack_fffffffffffff8c0);
    amrex::FArrayBox::~FArrayBox((FArrayBox *)0x7c0f0a);
    amrex::MFIter::operator++(&local_468);
  }
  amrex::MFIter::~MFIter((MFIter *)in_stack_fffffffffffff8c0);
  amrex::EB_set_covered((MultiFab *)in_stack_fffffffffffff8c0,(Real)mfi_00);
  amrex::EB_set_covered((MultiFab *)in_stack_fffffffffffff8c0,(Real)mfi_00);
  amrex::MultiFab::~MultiFab((MultiFab *)0x7c0fa0);
  std::unique_ptr<amrex::EBFArrayBoxFactory,_std::default_delete<amrex::EBFArrayBoxFactory>_>::
  ~unique_ptr((unique_ptr<amrex::EBFArrayBoxFactory,_std::default_delete<amrex::EBFArrayBoxFactory>_>
               *)in_stack_fffffffffffff8d0);
  amrex::Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::~Vector
            ((Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)0x7c0fba);
  amrex::BoxArray::~BoxArray((BoxArray *)in_stack_fffffffffffff8c0);
  return;
}

Assistant:

void
NavierStokesBase::SyncProjInterp (MultiFab& phi,
                                  int       c_lev,
                                  MultiFab& P_new,
                                  MultiFab& P_old,
                                  int       f_lev,
                                  IntVect&  ratio)
{
    BL_PROFILE("NavierStokesBase:::SyncProjInterp()");

    const BoxArray& P_grids = P_new.boxArray();
    const int       N       = P_grids.size();

    BoxArray crse_ba(N);

#ifdef _OPENMP
#pragma omp parallel for
#endif
    for (int i = 0; i < N; i++)
        crse_ba.set(i,node_bilinear_interp.CoarseBox(P_grids[i],ratio));

    // None  of these 3 are actually used by node_bilinear_interp()
    Vector<BCRec> bc(AMREX_SPACEDIM);
    const Geometry& fgeom   = parent->Geom(f_lev);
    const Geometry& cgeom   = parent->Geom(c_lev);

#ifdef AMREX_USE_EB
    // I am unsure of EBSupport and ng (set to 1 here)
    // need 1 ghost cell to use EB_set_covered on nodal MF
    // Factory is always CC, regardless of status of crse_ba
    auto factory = makeEBFabFactory(cgeom,crse_ba,P_new.DistributionMap(),{1,1,1},EBSupport::basic);
    MultiFab     crse_phi(crse_ba,P_new.DistributionMap(),1,0,MFInfo(),*factory);

#else
    MultiFab     crse_phi(crse_ba,P_new.DistributionMap(),1,0);
#endif

    crse_phi.setVal(1.e200);
    crse_phi.ParallelCopy(phi,0,0,1);

#ifdef AMREX_USE_EB
    // FIXME -
    // For now, just zero covered fine cells. Better interpolation to come...
    ///
    EB_set_covered(crse_phi,0.);
#endif

#ifdef _OPENMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(P_new,TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {
	const Box&  bx     = mfi.tilebox();
	FArrayBox fine_phi(bx,1);
	Elixir fine_phi_i = fine_phi.elixir();
	node_bilinear_interp.interp(crse_phi[mfi],0,fine_phi,0,1,
				    fine_phi.box(),ratio,cgeom,fgeom,bc,
				    0,Press_Type,RunOn::Gpu);

	auto const& f_phi    = fine_phi.array();
	auto const& p_new    = P_new.array(mfi);
	auto const& p_old    = P_old.array(mfi);
	amrex::ParallelFor(bx, [f_phi, p_old, p_new]
        AMREX_GPU_DEVICE(int i, int j, int k) noexcept
        {
	  p_new(i,j,k) += f_phi(i,j,k);
	  p_old(i,j,k) += f_phi(i,j,k);
	});
    }

#ifdef AMREX_USE_EB
    // FIXME? - this can probably go after new interpolation is implemented
    EB_set_covered(P_new,0.);
    EB_set_covered(P_old,0.);
#endif

}